

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O0

void __thiscall
JsonObject_TrailingCommaExtensionEnabled_Test::TestBody
          (JsonObject_TrailingCommaExtensionEnabled_Test *this)

{
  bool bVar1;
  MockSpec<std::error_code_()> *pMVar2;
  TypedExpectation<std::error_code_()> *pTVar3;
  MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pMVar4;
  TypedExpectation<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pTVar5;
  MockSpec<std::error_code_(unsigned_long)> *this_00;
  TypedExpectation<std::error_code_(unsigned_long)> *this_01;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_02;
  char *message;
  extensions extensions;
  mock_json_callbacks *in_RSI;
  mock_json_callbacks *this_03;
  char *in_R9;
  string local_258;
  AssertHelper local_238;
  Message local_230;
  bool local_221;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_;
  undefined1 local_1f0 [8];
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  MockSpec<std::error_code_()> local_148;
  WithoutMatchers local_131;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_130;
  MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_118;
  WithoutMatchers local_f1;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_f0;
  MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_d8;
  WithoutMatchers local_b1;
  Matcher<unsigned_long> local_b0;
  MockSpec<std::error_code_(unsigned_long)> local_98;
  WithoutMatchers local_71;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_70;
  MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_58;
  WithoutMatchers local_35 [13];
  MockSpec<std::error_code_()> local_28;
  InSequence local_11;
  JsonObject_TrailingCommaExtensionEnabled_Test *pJStack_10;
  InSequence _;
  JsonObject_TrailingCommaExtensionEnabled_Test *this_local;
  
  pJStack_10 = this;
  testing::InSequence::InSequence(&local_11);
  local_28.function_mocker_ =
       (FunctionMocker<std::error_code_()> *)
       mock_json_callbacks::gmock_begin_object
                 ((MockSpec<std::error_code_()> *)&(this->super_JsonObject).callbacks_,in_RSI);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::MockSpec<std::error_code_()>::operator()
                     (&local_28,local_35,(void *)0x0);
  pTVar3 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
                      ,0xa4,"callbacks_","begin_object ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar3,1);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher(&local_70,"a");
  mock_json_callbacks::gmock_key
            (&local_58,&(this->super_JsonObject).callbacks_.super_mock_json_callbacks,&local_70);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::
           MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::operator()(&local_58,&local_71,(void *)0x0);
  pTVar5 = testing::internal::
           MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
                      ,0xa5,"callbacks_","key (\"a\")");
  testing::internal::
  TypedExpectation<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Times(pTVar5,1);
  testing::internal::
  MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~MockSpec(&local_58);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_70);
  testing::Matcher<unsigned_long>::Matcher(&local_b0,0x10);
  mock_json_callbacks::gmock_uint64_value
            (&local_98,&(this->super_JsonObject).callbacks_.super_mock_json_callbacks,&local_b0);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<std::error_code_(unsigned_long)>::operator()
                      (&local_98,&local_b1,(void *)0x0);
  this_01 = testing::internal::MockSpec<std::error_code_(unsigned_long)>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
                       ,0xa6,"callbacks_","uint64_value (16)");
  testing::internal::TypedExpectation<std::error_code_(unsigned_long)>::Times(this_01,1);
  testing::internal::MockSpec<std::error_code_(unsigned_long)>::~MockSpec(&local_98);
  testing::Matcher<unsigned_long>::~Matcher(&local_b0);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher(&local_f0,"b");
  mock_json_callbacks::gmock_key
            (&local_d8,&(this->super_JsonObject).callbacks_.super_mock_json_callbacks,&local_f0);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::
           MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::operator()(&local_d8,&local_f1,(void *)0x0);
  pTVar5 = testing::internal::
           MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
                      ,0xa7,"callbacks_","key (\"b\")");
  testing::internal::
  TypedExpectation<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Times(pTVar5,1);
  testing::internal::
  MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~MockSpec(&local_d8);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_f0);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher(&local_130,"c");
  mock_json_callbacks::gmock_string_value
            (&local_118,&(this->super_JsonObject).callbacks_.super_mock_json_callbacks,&local_130);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::
           MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::operator()(&local_118,&local_131,(void *)0x0);
  pTVar5 = testing::internal::
           MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
                      ,0xa8,"callbacks_","string_value (\"c\")");
  this_03 = (mock_json_callbacks *)0x1;
  testing::internal::
  TypedExpectation<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Times(pTVar5,1);
  testing::internal::
  MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~MockSpec(&local_118);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_130);
  local_148.function_mocker_ =
       (FunctionMocker<std::error_code_()> *)
       mock_json_callbacks::gmock_end_object
                 ((MockSpec<std::error_code_()> *)&(this->super_JsonObject).callbacks_,this_03);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::MockSpec<std::error_code_()>::operator()
                     (&local_148,(WithoutMatchers *)((long)&p.coordinate_.row + 3),(void *)0x0);
  extensions = 0x1effd7;
  pTVar3 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
                      ,0xa9,"callbacks_","end_object ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar3,1);
  testing::InSequence::~InSequence(&local_11);
  pstore::json::make_parser<callbacks_proxy<mock_json_callbacks>>
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_1f0,
             (json *)&(this->super_JsonObject).proxy_,(callbacks_proxy<mock_json_callbacks> *)0x10,
             extensions);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar_.message_,"{ \"a\":16, \"b\":\"c\" , }",0x15);
  this_02 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input
                      ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_1f0,
                       (string *)&gtest_ar_.message_);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_02);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  local_221 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::has_error
                        ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_1f0);
  local_221 = !local_221;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_220,&local_221,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_258,(internal *)local_220,(AssertionResult *)"p.has_error ()","true","false",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0xb0,message);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_1f0);
  return;
}

Assistant:

TEST_F (JsonObject, TrailingCommaExtensionEnabled) {
    {
        ::testing::InSequence _;
        EXPECT_CALL (callbacks_, begin_object ()).Times (1);
        EXPECT_CALL (callbacks_, key ("a")).Times (1);
        EXPECT_CALL (callbacks_, uint64_value (16)).Times (1);
        EXPECT_CALL (callbacks_, key ("b")).Times (1);
        EXPECT_CALL (callbacks_, string_value ("c")).Times (1);
        EXPECT_CALL (callbacks_, end_object ()).Times (1);
    }

    // An object with a trailing comma but with the extension _enabled_. Note that there is
    // deliberate whitespace around the final comma.
    auto p = json::make_parser (proxy_, json::extensions::object_trailing_comma);
    p.input (R"({ "a":16, "b":"c" , })"s).eof ();
    EXPECT_FALSE (p.has_error ());
}